

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

void __thiscall
pstd::
vector<pstd::optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
::vector(vector<pstd::optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         *this,size_t count,
        optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *value,polymorphic_allocator<pstd::optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *alloc)

{
  size_t sVar1;
  long lVar2;
  
  (this->alloc).memoryResource = alloc->memoryResource;
  this->ptr = (optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x0;
  this->nAlloc = 0;
  this->nStored = 0;
  reserve(this,count);
  if (count != 0) {
    lVar2 = 0;
    sVar1 = count;
    do {
      optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::optional((optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&this->ptr->optionalValue + lVar2),value);
      lVar2 = lVar2 + 0x30;
      sVar1 = sVar1 - 1;
    } while (sVar1 != 0);
  }
  this->nStored = count;
  return;
}

Assistant:

vector(size_t count, const T &value, const Allocator &alloc = {}) : alloc(alloc) {
        reserve(count);
        for (size_t i = 0; i < count; ++i)
            this->alloc.template construct<T>(ptr + i, value);
        nStored = count;
    }